

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O3

mz_bool mz_zip_file_stat_internal
                  (mz_zip_archive *pZip,mz_uint file_index,mz_uint8 *pCentral_dir_header,
                  mz_zip_archive_file_stat *pStat,mz_bool *pFound_zip64_extra_data)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  mz_zip_internal_state *pmVar6;
  void *pvVar7;
  mz_uint64 mVar8;
  mz_bool mVar9;
  time_t tVar10;
  ulong uVar11;
  ulong uVar12;
  mz_zip_error mVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  mz_bool mVar17;
  ulong uVar18;
  ulong uVar19;
  short *psVar20;
  mz_uint64 *pmVar21;
  tm local_68;
  
  if (pFound_zip64_extra_data != (mz_bool *)0x0) {
    *pFound_zip64_extra_data = 0;
  }
  if (pCentral_dir_header == (mz_uint8 *)0x0 || pStat == (mz_zip_archive_file_stat *)0x0) {
    if (pZip == (mz_zip_archive *)0x0) {
      return 0;
    }
    pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    return 0;
  }
  pStat->m_file_index = file_index;
  uVar18 = (ulong)file_index;
  if ((pZip->m_pState->m_central_dir_offsets).m_size <= uVar18) goto LAB_0013bc49;
  pStat->m_central_dir_ofs =
       (ulong)*(uint *)((long)(pZip->m_pState->m_central_dir_offsets).m_p + uVar18 * 4);
  pStat->m_version_made_by = *(mz_uint16 *)(pCentral_dir_header + 4);
  pStat->m_version_needed = *(mz_uint16 *)(pCentral_dir_header + 6);
  pStat->m_bit_flag = *(mz_uint16 *)(pCentral_dir_header + 8);
  pStat->m_method = *(mz_uint16 *)(pCentral_dir_header + 10);
  uVar1 = *(ushort *)(pCentral_dir_header + 0xe);
  uVar2 = *(ushort *)(pCentral_dir_header + 0xc);
  local_68.tm_wday = 0;
  local_68.tm_yday = 0;
  local_68.tm_gmtoff = 0;
  local_68.tm_zone = (char *)0x0;
  local_68.tm_isdst = -1;
  local_68._36_4_ = 0;
  local_68.tm_year = (uVar1 >> 9) + 0x50;
  local_68.tm_mday = uVar1 & 0x1f;
  local_68.tm_mon = (uVar1 >> 5 & 0xf) - 1;
  local_68.tm_hour = (int)(uVar2 >> 0xb);
  local_68.tm_min = uVar2 >> 5 & 0x3f;
  local_68.tm_sec = (uint)uVar2 * 2 & 0x3e;
  tVar10 = mktime(&local_68);
  pStat->m_time = tVar10;
  pStat->m_crc32 = *(mz_uint32 *)(pCentral_dir_header + 0x10);
  uVar3 = *(uint *)(pCentral_dir_header + 0x14);
  uVar11 = (ulong)uVar3;
  pStat->m_comp_size = uVar11;
  uVar4 = *(uint *)(pCentral_dir_header + 0x18);
  uVar12 = (ulong)uVar4;
  pStat->m_uncomp_size = uVar12;
  pStat->m_internal_attr = *(mz_uint16 *)(pCentral_dir_header + 0x24);
  pStat->m_external_attr = *(mz_uint32 *)(pCentral_dir_header + 0x26);
  uVar5 = *(uint *)(pCentral_dir_header + 0x2a);
  pStat->m_local_header_ofs = (ulong)uVar5;
  uVar16 = (uint)*(ushort *)(pCentral_dir_header + 0x1c);
  if (0x1fe < *(ushort *)(pCentral_dir_header + 0x1c)) {
    uVar16 = 0x1ff;
  }
  memcpy(pStat->m_filename,pCentral_dir_header + 0x2e,(ulong)uVar16);
  pStat->m_filename[uVar16] = '\0';
  uVar16 = 0x1ff;
  if (*(ushort *)(pCentral_dir_header + 0x20) < 0x1ff) {
    uVar16 = (uint)*(ushort *)(pCentral_dir_header + 0x20);
  }
  pStat->m_comment_size = uVar16;
  memcpy(pStat->m_comment,
         pCentral_dir_header +
         (ulong)*(ushort *)(pCentral_dir_header + 0x1e) +
         (ulong)*(ushort *)(pCentral_dir_header + 0x1c) + 0x2e,(ulong)uVar16);
  pStat->m_comment[uVar16] = '\0';
  pmVar6 = pZip->m_pState;
  if (pmVar6 == (mz_zip_internal_state *)0x0) {
    pStat->m_is_directory = 0;
    pStat->m_is_encrypted = 0;
    mVar13 = MZ_ZIP_INVALID_PARAMETER;
  }
  else {
    if (file_index < pZip->m_total_files) {
      if (((pmVar6->m_central_dir_offsets).m_size <= uVar18) ||
         (uVar15 = (ulong)*(uint *)((long)(pmVar6->m_central_dir_offsets).m_p + uVar18 * 4),
         (pmVar6->m_central_dir).m_size <= uVar15)) goto LAB_0013bc49;
      pvVar7 = (pmVar6->m_central_dir).m_p;
      if (pvVar7 == (void *)0x0) goto LAB_0013baa0;
      uVar19 = (ulong)*(ushort *)((long)pvVar7 + uVar15 + 0x1c);
      if ((uVar19 == 0) || (uVar16 = 1, *(char *)((long)pvVar7 + uVar19 + uVar15 + 0x2d) != '/')) {
        uVar16 = *(uint *)((long)pvVar7 + uVar15 + 0x26) >> 4 & 1;
      }
    }
    else {
LAB_0013baa0:
      uVar16 = 0;
      pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    }
    pStat->m_is_directory = uVar16;
    if (file_index < pZip->m_total_files) {
      if (((pmVar6->m_central_dir_offsets).m_size <= uVar18) ||
         (uVar15 = (ulong)*(uint *)((long)(pmVar6->m_central_dir_offsets).m_p + uVar18 * 4),
         (pmVar6->m_central_dir).m_size <= uVar15)) goto LAB_0013bc49;
      pvVar7 = (pmVar6->m_central_dir).m_p;
      if (pvVar7 == (void *)0x0) goto LAB_0013bae2;
      uVar16 = (uint)((*(byte *)((long)pvVar7 + uVar15 + 8) & 0x41) != 0);
    }
    else {
LAB_0013bae2:
      uVar16 = 0;
      pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    }
    pStat->m_is_encrypted = uVar16;
    mVar13 = MZ_ZIP_INVALID_PARAMETER;
    if (file_index < pZip->m_total_files) {
      if (((pmVar6->m_central_dir_offsets).m_size <= uVar18) ||
         (uVar18 = (ulong)*(uint *)((long)(pmVar6->m_central_dir_offsets).m_p + uVar18 * 4),
         (pmVar6->m_central_dir).m_size <= uVar18)) {
LAB_0013bc49:
        __assert_fail("index < pArray->m_size",
                      "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/cpp/src/../../Zippy/library/Zippy/miniz/miniz.h"
                      ,0x129b,"mz_uint mz_zip_array_range_check(const mz_zip_array *, mz_uint)");
      }
      pvVar7 = (pmVar6->m_central_dir).m_p;
      if ((pvVar7 != (void *)0x0) &&
         (mVar13 = MZ_ZIP_UNSUPPORTED_METHOD,
         (*(ushort *)((long)pvVar7 + uVar18 + 10) & 0xfff7) == 0)) {
        uVar1 = *(ushort *)((long)pvVar7 + uVar18 + 8);
        mVar13 = MZ_ZIP_UNSUPPORTED_ENCRYPTION;
        if ((uVar1 & 0x41) == 0) {
          mVar13 = MZ_ZIP_UNSUPPORTED_FEATURE;
          mVar17 = 1;
          if ((uVar1 & 0x20) == 0) goto LAB_0013bb6e;
        }
      }
    }
  }
  mVar17 = 0;
  pZip->m_last_error = mVar13;
LAB_0013bb6e:
  mVar9 = 1;
  pStat->m_is_supported = mVar17;
  if (uVar12 < uVar11) {
    uVar12 = uVar11;
  }
  uVar16 = (uint)uVar12;
  if (uVar12 <= uVar5) {
    uVar16 = uVar5;
  }
  if ((uVar16 == 0xffffffff) &&
     (uVar16 = (uint)*(ushort *)(pCentral_dir_header + 0x1e),
     *(ushort *)(pCentral_dir_header + 0x1e) != 0)) {
    psVar20 = (short *)(pCentral_dir_header + 0x2e + *(ushort *)(pCentral_dir_header + 0x1c));
    while (3 < uVar16) {
      uVar1 = psVar20[1];
      uVar14 = (uint)uVar1;
      if ((ulong)uVar16 < (ulong)uVar1 + 4) break;
      if (*psVar20 == 1) {
        if (pFound_zip64_extra_data != (mz_bool *)0x0) {
          *pFound_zip64_extra_data = 1;
        }
        if (uVar4 == 0xffffffff) {
          if (uVar1 < 8) break;
          pmVar21 = (mz_uint64 *)(psVar20 + 6);
          uVar14 = uVar1 - 8;
          pStat->m_uncomp_size = *(mz_uint64 *)(psVar20 + 2);
        }
        else {
          pmVar21 = (mz_uint64 *)(psVar20 + 2);
        }
        if (uVar3 == 0xffffffff) {
          if (uVar14 < 8) break;
          mVar8 = *pmVar21;
          pmVar21 = pmVar21 + 1;
          uVar14 = uVar14 - 8;
          pStat->m_comp_size = mVar8;
        }
        if (uVar5 != 0xffffffff) {
          return 1;
        }
        if (7 < uVar14) {
          pStat->m_local_header_ofs = *pmVar21;
          return 1;
        }
        break;
      }
      psVar20 = (short *)((long)psVar20 + (ulong)uVar1 + 4);
      uVar16 = (uVar16 - uVar1) - 4;
      if (uVar16 == 0) {
        return 1;
      }
    }
    pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
    mVar9 = 0;
  }
  return mVar9;
}

Assistant:

static mz_bool mz_zip_file_stat_internal(mz_zip_archive* pZip,
                                         mz_uint file_index,
                                         const mz_uint8* pCentral_dir_header,
                                         mz_zip_archive_file_stat* pStat,
                                         mz_bool* pFound_zip64_extra_data) {

    mz_uint n;
    const mz_uint8* p = pCentral_dir_header;

    if (pFound_zip64_extra_data)
        *pFound_zip64_extra_data = MZ_FALSE;

    if ((!p) || (!pStat))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    /* Extract fields from the central directory record. */
    pStat->m_file_index = file_index;
    pStat->m_central_dir_ofs = MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_central_dir_offsets, mz_uint32, file_index);
    pStat->m_version_made_by = MZ_READ_LE16(p + MZ_ZIP_CDH_VERSION_MADE_BY_OFS);
    pStat->m_version_needed = MZ_READ_LE16(p + MZ_ZIP_CDH_VERSION_NEEDED_OFS);
    pStat->m_bit_flag = MZ_READ_LE16(p + MZ_ZIP_CDH_BIT_FLAG_OFS);
    pStat->m_method = MZ_READ_LE16(p + MZ_ZIP_CDH_METHOD_OFS);
#ifndef MINIZ_NO_TIME
    pStat->m_time = mz_zip_dos_to_time_t(MZ_READ_LE16(p + MZ_ZIP_CDH_FILE_TIME_OFS),
                                         MZ_READ_LE16(p + MZ_ZIP_CDH_FILE_DATE_OFS));
#endif
    pStat->m_crc32 = MZ_READ_LE32(p + MZ_ZIP_CDH_CRC32_OFS);
    pStat->m_comp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_COMPRESSED_SIZE_OFS);
    pStat->m_uncomp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_DECOMPRESSED_SIZE_OFS);
    pStat->m_internal_attr = MZ_READ_LE16(p + MZ_ZIP_CDH_INTERNAL_ATTR_OFS);
    pStat->m_external_attr = MZ_READ_LE32(p + MZ_ZIP_CDH_EXTERNAL_ATTR_OFS);
    pStat->m_local_header_ofs = MZ_READ_LE32(p + MZ_ZIP_CDH_LOCAL_HEADER_OFS);

    /* Copy as much of the filename and comment as possible. */
    n = MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS);
    n = MZ_MIN(n, MZ_ZIP_MAX_ARCHIVE_FILENAME_SIZE - 1);
    memcpy(pStat->m_filename, p + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE, n);
    pStat->m_filename[n] = '\0';

    n = MZ_READ_LE16(p + MZ_ZIP_CDH_COMMENT_LEN_OFS);
    n = MZ_MIN(n, MZ_ZIP_MAX_ARCHIVE_FILE_COMMENT_SIZE - 1);
    pStat->m_comment_size = n;
    memcpy(pStat->m_comment,
           p + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS)
                   + MZ_READ_LE16(p + MZ_ZIP_CDH_EXTRA_LEN_OFS),
           n);
    pStat->m_comment[n] = '\0';

    /* Set some flags for convienance */
    pStat->m_is_directory = mz_zip_reader_is_file_a_directory(pZip, file_index);
    pStat->m_is_encrypted = mz_zip_reader_is_file_encrypted(pZip, file_index);
    pStat->m_is_supported = mz_zip_reader_is_file_supported(pZip, file_index);

    /* See if we need to read any zip64 extended information fields. */
    /* Confusingly, these zip64 fields can be present even on non-zip64 archives (Debian zip on a huge files from stdin piped to stdout creates them). */
    if (MZ_MAX(MZ_MAX(pStat->m_comp_size, pStat->m_uncomp_size), pStat->m_local_header_ofs) == MZ_UINT32_MAX) {
        /* Attempt to find zip64 extended information field in the entry's extra data */
        mz_uint32 extra_size_remaining = MZ_READ_LE16(p + MZ_ZIP_CDH_EXTRA_LEN_OFS);

        if (extra_size_remaining) {
            const mz_uint8* pExtra_data =
                                  p + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS);

            do {
                mz_uint32 field_id;
                mz_uint32 field_data_size;

                if (extra_size_remaining < (sizeof(mz_uint16) * 2))
                    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

                field_id = MZ_READ_LE16(pExtra_data);
                field_data_size = MZ_READ_LE16(pExtra_data + sizeof(mz_uint16));

                if ((field_data_size + sizeof(mz_uint16) * 2) > extra_size_remaining)
                    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

                if (field_id == MZ_ZIP64_EXTENDED_INFORMATION_FIELD_HEADER_ID) {
                    const mz_uint8* pField_data = pExtra_data + sizeof(mz_uint16) * 2;
                    mz_uint32 field_data_remaining = field_data_size;

                    if (pFound_zip64_extra_data)
                        *pFound_zip64_extra_data = MZ_TRUE;

                    if (pStat->m_uncomp_size == MZ_UINT32_MAX) {
                        if (field_data_remaining < sizeof(mz_uint64))
                            return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

                        pStat->m_uncomp_size = MZ_READ_LE64(pField_data);
                        pField_data += sizeof(mz_uint64);
                        field_data_remaining -= sizeof(mz_uint64);
                    }

                    if (pStat->m_comp_size == MZ_UINT32_MAX) {
                        if (field_data_remaining < sizeof(mz_uint64))
                            return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

                        pStat->m_comp_size = MZ_READ_LE64(pField_data);
                        pField_data += sizeof(mz_uint64);
                        field_data_remaining -= sizeof(mz_uint64);
                    }

                    if (pStat->m_local_header_ofs == MZ_UINT32_MAX) {
                        if (field_data_remaining < sizeof(mz_uint64))
                            return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

                        pStat->m_local_header_ofs = MZ_READ_LE64(pField_data);
                        pField_data += sizeof(mz_uint64);
                        field_data_remaining -= sizeof(mz_uint64);
                    }

                    break;
                }

                pExtra_data += sizeof(mz_uint16) * 2 + field_data_size;
                extra_size_remaining = extra_size_remaining - sizeof(mz_uint16) * 2 - field_data_size;
            } while (extra_size_remaining);
        }
    }

    return MZ_TRUE;
}